

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_edge_detection.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined2 uVar1;
  undefined2 uVar2;
  uchar *puVar3;
  _func_int **pp_Var4;
  uint32_t uVar5;
  uint8_t uVar6;
  imageException *this;
  pointer pPVar7;
  PaintColor local_1c4;
  undefined1 local_1c0 [16];
  uint8_t local_1b0;
  uint8_t uStack_1af;
  uint32_t local_1ac;
  uchar *local_1a8;
  uint8_t local_1a0;
  EdgeDetection edgeDetection;
  string filePath;
  Image original;
  string local_118;
  UiWindowX11 window;
  EdgeParameter edgeParameter;
  
  std::__cxx11::string::string((string *)&filePath,"mercury.bmp",(allocator *)&window);
  if (1 < argc) {
    std::__cxx11::string::assign((char *)&filePath);
  }
  Bitmap_Operation::Load(&original,&filePath);
  if (original._data != (uchar *)0x0) {
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              ((ImageTemplate<unsigned_char> *)local_1c0,&original);
    if (local_1b0 != '\x01') {
      Image_Function::ConvertToGrayScale((Image *)&window,(Image *)local_1c0);
      uVar6 = (uint8_t)window.super_UiWindow._image._data;
      uVar5 = window.super_UiWindow._image._height;
      pp_Var4 = window.super_UiWindow._image._vptr_ImageTemplate;
      puVar3 = local_1a8;
      uVar1 = _local_1b0;
      window.super_UiWindow._image._vptr_ImageTemplate = (_func_int **)local_1c0._8_8_;
      local_1c0._8_8_ = pp_Var4;
      local_1b0 = (uint8_t)window.super_UiWindow._image._width;
      uStack_1af = window.super_UiWindow._image._width._1_1_;
      uVar2 = _local_1b0;
      local_1b0 = (uint8_t)uVar1;
      uStack_1af = SUB21(uVar1,1);
      window.super_UiWindow._image._width._0_1_ = local_1b0;
      window.super_UiWindow._image._width._1_1_ = uStack_1af;
      window.super_UiWindow._image._height = local_1ac;
      local_1ac = uVar5;
      local_1a8 = (uchar *)window.super_UiWindow._image._16_8_;
      window.super_UiWindow._image._16_8_ = puVar3;
      window.super_UiWindow._image._data._0_1_ = local_1a0;
      local_1a0 = uVar6;
      _local_1b0 = uVar2;
      PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
                ((ImageTemplate<unsigned_char> *)&window);
    }
    EdgeParameter::EdgeParameter(&edgeParameter,LEFT_TO_RIGHT,ANY,ALL,1,1,0,0,'\n');
    edgeParameter.minimumContrast = '@';
    edgeDetection.negativeEdgePoint.
    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    edgeDetection.negativeEdgePoint.
    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    edgeParameter.contrastCheckLeftSideOffset = 3;
    edgeParameter.contrastCheckRightSideOffset = 3;
    edgeDetection.positiveEdgePoint.
    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    edgeDetection.positiveEdgePoint.
    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    edgeDetection.positiveEdgePoint.
    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    edgeDetection.negativeEdgePoint.
    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    EdgeDetectionBase<double>::find(&edgeDetection,(Image *)local_1c0,&edgeParameter);
    std::__cxx11::string::string((string *)&local_118,"Edge detection",(allocator *)&local_1c4);
    UiWindowX11::UiWindowX11(&window,&original,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    local_118._M_dataplus._M_p._0_4_ = 0xff14ff14;
    local_1c4.red = 0xff;
    local_1c4.green = '\x14';
    local_1c4.blue = '\x14';
    local_1c4.alpha = 0xff;
    for (pPVar7 = edgeDetection.positiveEdgePoint.
                  super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pPVar7 != edgeDetection.positiveEdgePoint.
                  super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pPVar7 = pPVar7 + 1) {
      UiWindowX11::drawPoint(&window,pPVar7,(PaintColor *)&local_118);
    }
    for (pPVar7 = edgeDetection.negativeEdgePoint.
                  super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pPVar7 != edgeDetection.negativeEdgePoint.
                  super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pPVar7 = pPVar7 + 1) {
      UiWindowX11::drawPoint(&window,pPVar7,&local_1c4);
    }
    UiWindow::show(&window.super_UiWindow);
    UiWindowX11::~UiWindowX11(&window);
    EdgeDetectionBase<double>::~EdgeDetectionBase(&edgeDetection);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)local_1c0);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&original);
    std::__cxx11::string::~string((string *)&filePath);
    return 0;
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&edgeDetection,"Cannot load ",(allocator *)local_1c0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&window,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&edgeDetection
                 ,&filePath);
  imageException::imageException(this,(string *)&window);
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

int main( int argc, char * argv[] )
{
    try // <---- do not forget to put your code into try.. catch block!
    {
        std::string filePath = "mercury.bmp"; // default image path
        if ( argc > 1 ) // Check input data
            filePath = argv[1];

        const PenguinV_Image::Image original = Bitmap_Operation::Load( filePath );

        if ( original.empty() ) // if the image is empty it means that the image doesn't exist or the file is not readable
            throw imageException( std::string("Cannot load ") + filePath );

        PenguinV_Image::Image image( original );
        if ( image.colorCount() != PenguinV_Image::GRAY_SCALE ) // convert to gray-scale image if it's not
            image = Image_Function::ConvertToGrayScale( image );

        EdgeParameter edgeParameter;
        edgeParameter.minimumContrast = 64u; // in intensity grades
        // We know that image would give a lot of false detected points due to single pixel intensity variations
        // In such case we set a range of pixels to verify that found edge point is really an edge
        edgeParameter.contrastCheckLeftSideOffset  = 3u; // in pixels
        edgeParameter.contrastCheckRightSideOffset = 3u; // in pixels

        EdgeDetection edgeDetection;
        edgeDetection.find( image, edgeParameter );

        const std::vector<Point2d> & negativeEdge = edgeDetection.negativeEdge();
        const std::vector<Point2d> & positiveEdge = edgeDetection.positiveEdge();

#if defined (_WIN32)
        UiWindowWin window( original, "Edge detection" );
#else
        UiWindowX11 window( original, "Edge detection" );
#endif

        const PaintColor positiveColor( 20, 255, 20 ); // green
        const PaintColor negativeColor( 255, 20, 20 ); // red

        for ( std::vector<Point2d>::const_iterator point = positiveEdge.cbegin(); point != positiveEdge.cend(); ++point )
            window.drawPoint( *point, positiveColor );

        for ( std::vector<Point2d>::const_iterator point = negativeEdge.cbegin(); point != negativeEdge.cend(); ++point )
            window.drawPoint( *point, negativeColor );

        window.show();
    }
    catch ( const std::exception & ex ) { // uh-oh, something went wrong!
        std::cout << ex.what() << ". Press any button to continue." << std::endl;
        std::cin.ignore();
        return 1;
    }
    catch ( ... ) { // uh-oh, something terrible happen!
        std::cout << "Generic exception raised. Press any button to continue." << std::endl;
        std::cin.ignore();
        return 2;
    }

    return 0;
}